

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarOutdec(Abc_Ntk_t *pNtk,int nLits,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  char *pcVar2;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int nLits_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    pAig = Abc_NtkToDar(pNtk,0,1);
    if (pAig == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      pMan_00 = Saig_ManDecPropertyOutput(pAig,nLits,fVerbose);
      Aig_ManStop(pAig);
      if (pMan_00 == (Aig_Man_t *)0x0) {
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      else {
        pNtk_local = Abc_NtkFromAigPhase(pMan_00);
        pcVar2 = Extra_UtilStrsav(pMan_00->pName);
        pNtk_local->pName = pcVar2;
        pcVar2 = Extra_UtilStrsav(pMan_00->pSpec);
        pNtk_local->pSpec = pcVar2;
        Aig_ManStop(pMan_00);
      }
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                ,0x11eb,"Abc_Ntk_t *Abc_NtkDarOutdec(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDarOutdec( Abc_Ntk_t * pNtk, int nLits, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pMan = Saig_ManDecPropertyOutput( pTemp = pMan, nLits, fVerbose );
    Aig_ManStop( pTemp );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pMan->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}